

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::MessageOneofFieldGenerator::GenerateMergingCode
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (!($has_oneof_case$)) {\n  this.$oneof_name$_ = new $type$();\n}\ninput.readMessage(\n    (com.google.protobuf.nano.MessageNano) this.$oneof_name$_);\n$set_oneof_case$;\n"
                    );
  return;
}

Assistant:

void MessageOneofFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (!($has_oneof_case$)) {\n"
    "  this.$oneof_name$_ = new $type$();\n"
    "}\n"
    "input.readMessage(\n"
    "    (com.google.protobuf.nano.MessageNano) this.$oneof_name$_);\n"
    "$set_oneof_case$;\n");
}